

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

uint8_t * quicly_encode_max_data_frame(uint8_t *dst,uint64_t max_data)

{
  uint8_t *puVar1;
  uint8_t *in_RSI;
  undefined1 *in_RDI;
  uint64_t in_stack_ffffffffffffffe8;
  
  *in_RDI = 0x10;
  puVar1 = ptls_encode_quicint(in_RSI,in_stack_ffffffffffffffe8);
  return puVar1;
}

Assistant:

inline uint8_t *quicly_encode_max_data_frame(uint8_t *dst, uint64_t max_data)
{
    *dst++ = QUICLY_FRAME_TYPE_MAX_DATA;
    dst = quicly_encodev(dst, max_data);
    return dst;
}